

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall HVectorBase<HighsCDouble>::pack(HVectorBase<HighsCDouble> *this)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  HighsInt ipack;
  HighsInt i;
  int local_c;
  
  if ((*(byte *)(in_RDI + 0x78) & 1) != 0) {
    *(undefined1 *)(in_RDI + 0x78) = 0;
    *(undefined4 *)(in_RDI + 0x7c) = 0;
    for (local_c = 0; local_c < *(int *)(in_RDI + 4); local_c = local_c + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_c);
      iVar1 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),
                          (long)*(int *)(in_RDI + 0x7c));
      *pvVar2 = iVar1;
      pvVar3 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x20),
                          (long)iVar1);
      pvVar4 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x98),
                          (long)*(int *)(in_RDI + 0x7c));
      pvVar4->hi = pvVar3->hi;
      pvVar4->lo = pvVar3->lo;
      *(int *)(in_RDI + 0x7c) = *(int *)(in_RDI + 0x7c) + 1;
    }
  }
  return;
}

Assistant:

void HVectorBase<Real>::pack() {
  /*
   * Packing (if packFlag set): Pack values/indices in Vector.array
   * into packValue/Index
   */
  if (!packFlag) return;
  packFlag = false;
  packCount = 0;
  for (HighsInt i = 0; i < count; i++) {
    const HighsInt ipack = index[i];
    packIndex[packCount] = ipack;
    packValue[packCount] = array[ipack];
    packCount++;
  }
}